

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

void ngx_create_hashed_filename(ngx_path_t *path,u_char *file,size_t len)

{
  size_t __n;
  size_t sVar1;
  long lVar2;
  
  sVar1 = (path->name).len;
  file[path->len + sVar1] = '/';
  for (lVar2 = 0; (lVar2 != 3 && (__n = path->level[lVar2], __n != 0)); lVar2 = lVar2 + 1) {
    len = len - __n;
    file[sVar1] = '/';
    memcpy(file + sVar1 + 1,file + len,__n);
    sVar1 = sVar1 + 1 + __n;
  }
  return;
}

Assistant:

void
ngx_create_hashed_filename(ngx_path_t *path, u_char *file, size_t len)
{
    size_t      i, level;
    ngx_uint_t  n;

    i = path->name.len + 1;

    file[path->name.len + path->len]  = '/';

    for (n = 0; n < NGX_MAX_PATH_LEVEL; n++) {
        level = path->level[n];

        if (level == 0) {
            break;
        }

        len -= level;
        file[i - 1] = '/';
        ngx_memcpy(&file[i], &file[len], level);
        i += level + 1;
    }
}